

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_help.c
# Opt level: O0

int in_first_line(char *p,char *substring)

{
  int iVar1;
  size_t __n;
  bool bVar2;
  size_t l;
  char *substring_local;
  char *p_local;
  
  __n = strlen(substring);
  substring_local = p;
  while( true ) {
    bVar2 = false;
    if (*substring_local != '\0') {
      bVar2 = *substring_local != '\n';
    }
    if (!bVar2) break;
    iVar1 = memcmp(substring_local,substring,__n);
    if (iVar1 == 0) {
      return 1;
    }
    substring_local = substring_local + 1;
  }
  return 0;
}

Assistant:

static int
in_first_line(const char *p, const char *substring)
{
	size_t l = strlen(substring);

	while (*p != '\0' && *p != '\n') {
		if (memcmp(p, substring, l) == 0)
			return (1);
		++p;
	}
	return (0);
}